

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

void lwsl_emit_stderr_notimestamp(int level,char *line)

{
  int iVar1;
  int local_20;
  uint local_1c;
  int m;
  int n;
  char *line_local;
  int level_local;
  
  local_20 = 0xb;
  if (tty == '\0') {
    iVar1 = isatty(2);
    tty = (byte)iVar1 | 2;
  }
  if (tty == '\x03') {
    for (local_1c = 0x800; (local_1c != 0 && ((level & local_1c) == 0));
        local_1c = (int)local_1c >> 1) {
      local_20 = local_20 + -1;
    }
    fprintf(_stderr,"%c%s%s%c[0m",0x1b,colours[local_20],line);
  }
  else {
    fprintf(_stderr,"%s",line);
  }
  return;
}

Assistant:

void
lwsl_emit_stderr_notimestamp(int level, const char *line)
{
	int n, m = LWS_ARRAY_SIZE(colours) - 1;

	if (!tty)
		tty = isatty(2) | 2;

	if (tty == 3) {
		n = 1 << (LWS_ARRAY_SIZE(colours) - 1);
		while (n) {
			if (level & n)
				break;
			m--;
			n >>= 1;
		}
		fprintf(stderr, "%c%s%s%c[0m", 27, colours[m], line, 27);
	} else
		fprintf(stderr, "%s", line);
}